

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryRequirementsTests.cpp
# Opt level: O0

VkExtent3D vkt::memory::anon_unknown_0::makeExtentForImage(VkImageType imageType)

{
  VkExtent3D VVar1;
  undefined4 uStack_14;
  VkImageType imageType_local;
  VkExtent3D extent;
  
  _uStack_14 = 0x4000000040;
  extent.width = 4;
  if (imageType == VK_IMAGE_TYPE_1D) {
    extent.width = 1;
    _uStack_14 = 0x100000040;
  }
  else if (imageType == VK_IMAGE_TYPE_2D) {
    extent.width = 1;
  }
  VVar1.depth = extent.width;
  VVar1.width = uStack_14;
  VVar1.height = imageType_local;
  return VVar1;
}

Assistant:

VkExtent3D makeExtentForImage (const VkImageType imageType)
{
	VkExtent3D extent = { 64u, 64u, 4u };

	if (imageType == VK_IMAGE_TYPE_1D)
		extent.height = extent.depth = 1u;
	else if (imageType == VK_IMAGE_TYPE_2D)
		extent.depth = 1u;

	return extent;
}